

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

void setMethyleneProp(atom *a)

{
  byte *pbVar1;
  char *pcVar2;
  char **ppcVar3;
  char *__needle;
  
  __needle = a->r->resname;
  pcVar2 = strstr(":LYS:ILE:ARG:PRO:GLN:GLU:MET:CIS:SER:ASN:ASP:PHE:TYR:TRP:LEU:",__needle);
  if (pcVar2 != (char *)0x0) {
    for (ppcVar3 = &MethyleneAtomsTbl[0].alist;
        ((ResidueAndAtomPair *)(ppcVar3 + -1))->rlist != (char *)0x0; ppcVar3 = ppcVar3 + 3) {
      pcVar2 = strstr(((ResidueAndAtomPair *)(ppcVar3 + -1))->rlist,__needle);
      if ((pcVar2 != (char *)0x0) && (pcVar2 = strstr(*ppcVar3,a->atomname), pcVar2 != (char *)0x0))
      {
        pbVar1 = (byte *)((long)&a->props + 3);
        *pbVar1 = *pbVar1 | 0x40;
        return;
      }
    }
  }
  return;
}

Assistant:

void setMethyleneProp(atom *a) {
   ResidueAndAtomPair *pair;

   if(strstr(MethyleneResList, a->r->resname)) {
      for(pair = MethyleneAtomsTbl; pair->rlist && pair->alist; pair++) {
         if(   (strstr(pair->rlist, a->r->resname))
            && (strstr(pair->alist, a->atomname))   ) {
            a->props |= METHYLENE_PROP;
            break;
         }
      }
   }
}